

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::Update(Buffer *this,iterator it)

{
  reference piVar1;
  const_iterator local_30;
  _List_node_base *local_28;
  int local_1c;
  Buffer *pBStack_18;
  int pos;
  Buffer *this_local;
  iterator it_local;
  
  pBStack_18 = this;
  this_local = (Buffer *)it._M_node;
  piVar1 = std::_List_iterator<int>::operator*((_List_iterator<int> *)&this_local);
  local_1c = *piVar1;
  std::_List_const_iterator<int>::_List_const_iterator(&local_30,(iterator *)&this_local);
  local_28 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::erase(&this->Occupy_Block,local_30);
  this_local = (Buffer *)local_28;
  std::__cxx11::list<int,_std::allocator<int>_>::push_back(&this->Occupy_Block,&local_1c);
  Dirt(this,local_1c);
  UnLock(this,local_1c);
  return;
}

Assistant:

void Buffer::Update(list<int>::iterator it) {
	int pos = *it;
	it = this->Occupy_Block.erase(it);
	this->Occupy_Block.push_back(pos);
	this->Dirt(pos);
	this->UnLock(pos);							//������棬���Ա��滻��ȥ
}